

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O3

ssize_t __thiscall ParticleFilter::write(ParticleFilter *this,int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  ssize_t sVar2;
  long lVar3;
  ulong uVar4;
  ofstream dataFile;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,__fd);
  if (this->num_particles != 0) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      poVar1 = std::ostream::_M_insert<double>
                         (*(double *)
                           ((long)&((this->particles).
                                    super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                                    super__Vector_impl_data._M_start)->x + lVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = std::ostream::_M_insert<double>
                         (*(double *)
                           ((long)&((this->particles).
                                    super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                                    super__Vector_impl_data._M_start)->y + lVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = std::ostream::_M_insert<double>
                         (*(double *)
                           ((long)&((this->particles).
                                    super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                                    super__Vector_impl_data._M_start)->theta + lVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x28;
    } while (uVar4 < this->num_particles);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _log;
  std::filebuf::~filebuf(local_228);
  sVar2 = std::ios_base::~ios_base(local_138);
  return sVar2;
}

Assistant:

void ParticleFilter::write(std::string filename) const {
	// You don't need to modify this file.
	std::ofstream dataFile;
	dataFile.open(filename, std::ios::app);
	for (unsigned int i = 0; i < num_particles; ++i) {
		dataFile << particles[i].x << " " << particles[i].y << " " << particles[i].theta << "\n";
	}
	dataFile.close();
}